

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetField
               (uint32_t field_number,FieldDescriptor *field,Message *message,
               CodedInputStream *input)

{
  bool bVar1;
  Message *value;
  UnknownFieldSet *unknown_fields;
  Metadata MVar2;
  LogMessage LStack_38;
  
  MVar2 = Message::GetMetadata(message);
  if (field == (FieldDescriptor *)0x0) {
    unknown_fields = Reflection::MutableUnknownFields(MVar2.reflection,message);
    bVar1 = SkipMessageSetField(input,field_number,unknown_fields);
    return bVar1;
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if ((!bVar1) && (field->type_ == '\v')) {
    value = Reflection::MutableMessage(MVar2.reflection,message,field,input->extension_factory_);
    bVar1 = WireFormatLite::ReadMessage<google::protobuf::Message>(input,value);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
             ,0x169);
  absl::lts_20250127::log_internal::LogMessage::operator<<
            (&LStack_38,(char (*) [53])"Extensions of MessageSets must be optional messages.");
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&LStack_38);
  return false;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetField(uint32_t field_number,
                                              const FieldDescriptor* field,
                                              Message* message,
                                              io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();
  if (field == nullptr) {
    // We store unknown MessageSet extensions as groups.
    return SkipMessageSetField(
        input, field_number, message_reflection->MutableUnknownFields(message));
  } else if (field->is_repeated() ||
             field->type() != FieldDescriptor::TYPE_MESSAGE) {
    // This shouldn't happen as we only allow optional message extensions to
    // MessageSet.
    ABSL_LOG(ERROR) << "Extensions of MessageSets must be optional messages.";
    return false;
  } else {
    Message* sub_message = message_reflection->MutableMessage(
        message, field, input->GetExtensionFactory());
    return WireFormatLite::ReadMessage(input, sub_message);
  }
}